

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title.c
# Opt level: O1

void set_title(char *title)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  int extraout_EDX;
  undefined8 unaff_RBP;
  long *plVar4;
  int *piVar5;
  char buffer [512];
  int iStack_a50;
  char cStack_a4c;
  undefined1 *puStack_948;
  code *pcStack_940;
  code *pcStack_938;
  long lStack_928;
  undefined1 *puStack_920;
  char *pcStack_918;
  undefined1 *puStack_910;
  undefined1 *puStack_908;
  undefined8 uStack_900;
  code *pcStack_8f0;
  undefined1 *puStack_8e8;
  undefined1 **ppuStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 uStack_8c0;
  undefined8 uStack_8b8;
  long alStack_8a8 [17];
  undefined1 auStack_820 [511];
  undefined1 uStack_621;
  undefined1 auStack_620 [1024];
  char *pcStack_220;
  char acStack_208 [512];
  
  iVar1 = uv_get_process_title(acStack_208,0x200);
  if (iVar1 == 0) {
    iVar1 = uv_set_process_title(title);
    if (iVar1 != 0) goto LAB_00168580;
    iVar1 = uv_get_process_title(acStack_208,0x200);
    if (iVar1 != 0) goto LAB_00168585;
    iVar1 = strcmp(acStack_208,title);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    set_title_cold_1();
LAB_00168580:
    set_title_cold_2();
LAB_00168585:
    set_title_cold_3();
  }
  set_title_cold_4();
  plVar4 = &lStack_928;
  lStack_928 = 0x3ff;
  puVar3 = auStack_620;
  pcStack_938 = (code *)0x1685b6;
  pcStack_220 = title;
  iVar1 = uv_exepath(puVar3);
  if (iVar1 == 0) {
    unaff_RBP = 0;
    auStack_620[lStack_928] = 0;
    pcStack_938 = (code *)0x1685e7;
    memset(auStack_820,0x78,0x1ff);
    uStack_621 = 0;
    ppuStack_8e0 = &puStack_920;
    pcStack_918 = "process_title_big_argv_helper";
    uStack_900 = 0;
    uStack_8d8 = 0;
    uStack_8d0 = 0;
    uStack_8c8 = 0;
    uStack_8c0 = 0;
    uStack_8b8 = 0;
    pcStack_8f0 = exit_cb;
    pcStack_938 = (code *)0x168643;
    puStack_920 = puVar3;
    puStack_910 = auStack_820;
    puStack_908 = auStack_820;
    puStack_8e8 = puVar3;
    uVar2 = uv_default_loop();
    plVar4 = alStack_8a8;
    pcStack_938 = (code *)0x168656;
    iVar1 = uv_spawn(uVar2,plVar4,&pcStack_8f0);
    if (iVar1 != 0) goto LAB_001686b4;
    pcStack_938 = (code *)0x16865f;
    uVar2 = uv_default_loop();
    plVar4 = (long *)0x0;
    pcStack_938 = (code *)0x168669;
    iVar1 = uv_run(uVar2);
    if (iVar1 == 0) {
      pcStack_938 = (code *)0x168672;
      puVar3 = (undefined1 *)uv_default_loop();
      pcStack_938 = (code *)0x168686;
      uv_walk(puVar3,close_walk_cb,0);
      plVar4 = (long *)0x0;
      pcStack_938 = (code *)0x168690;
      uv_run(puVar3);
      pcStack_938 = (code *)0x168695;
      uVar2 = uv_default_loop();
      pcStack_938 = (code *)0x16869d;
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_001686be;
    }
  }
  else {
    pcStack_938 = (code *)0x1686b4;
    run_test_process_title_big_argv_cold_1();
LAB_001686b4:
    pcStack_938 = (code *)0x1686b9;
    run_test_process_title_big_argv_cold_2();
  }
  pcStack_938 = (code *)0x1686be;
  run_test_process_title_big_argv_cold_3();
LAB_001686be:
  pcStack_938 = exit_cb;
  run_test_process_title_big_argv_cold_4();
  if (plVar4 == (long *)0x0) {
    if (extraout_EDX == 0) {
      uv_close();
      return;
    }
  }
  else {
    pcStack_940 = (code *)0x1686da;
    exit_cb_cold_1();
  }
  pcStack_940 = process_title_big_argv;
  exit_cb_cold_2();
  piVar5 = &iStack_a50;
  puStack_948 = puVar3;
  pcStack_940 = (code *)unaff_RBP;
  memset(&iStack_a50,0,0x100);
  iStack_a50 = 0x6c696166;
  uv_get_process_title(&iStack_a50,0x100);
  if (cStack_a4c != '\0' || iStack_a50 != 0x6c696166) {
    return;
  }
  process_title_big_argv_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(piVar5,0);
  return;
}

Assistant:

static void set_title(const char* title) {
  char buffer[512];
  int err;

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  err = uv_set_process_title(title);
  ASSERT(err == 0);

  err = uv_get_process_title(buffer, sizeof(buffer));
  ASSERT(err == 0);

  ASSERT(strcmp(buffer, title) == 0);
}